

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multithreaded_test.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  pointer pcVar7;
  bool bVar8;
  allocator<char> local_60d;
  int local_60c;
  Exception_Handler local_608;
  pointer local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  char *modulepath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> threads;
  char *usepath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modulepaths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usepaths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_548;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_530;
  string local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  stringstream ss;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4d0;
  undefined1 local_4c8 [376];
  ChaiScript_Basic chai;
  
  pcVar3 = getenv("CHAI_USE_PATH");
  usepath = pcVar3;
  modulepath = getenv("CHAI_MODULE_PATH");
  usepaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  usepaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  usepaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&usepaths,
             (char (*) [1])0x242560);
  if (pcVar3 != (char *)0x0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&usepaths,
               &usepath);
  }
  modulepaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  modulepaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  modulepaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&modulepaths,
             (char (*) [1])0x242560);
  if (modulepath != (char *)0x0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&modulepaths,
               &modulepath);
  }
  std::
  make_unique<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>>
            ();
  local_5f0._M_dataplus._M_p = local_5c8._M_dataplus._M_p;
  local_5c8._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_530,&modulepaths);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_548,&usepaths);
  chaiscript::default_options();
  chaiscript::ChaiScript_Basic::ChaiScript_Basic
            (&chai,(unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
                    *)&local_5f0,&local_530,&local_548,
             (vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> *)&ss);
  std::_Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>::~_Vector_base
            ((_Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_> *)&ss);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_548);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_530);
  if ((long *)local_5f0._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_5f0._M_dataplus._M_p + 0x20))();
  }
  local_5f0._M_dataplus._M_p = (pointer)0x0;
  std::
  unique_ptr<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>,_std::default_delete<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>_>_>
  ::~unique_ptr((unique_ptr<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>,_std::default_delete<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>_>_>
                 *)&local_5c8);
  threads.
  super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  threads.
  super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.
  super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = std::thread::hardware_concurrency();
  iVar2 = 3;
  if (3 < iVar1) {
    iVar2 = iVar1;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Num threads: ");
  local_5f8 = (pointer)(ulong)(iVar2 - 1);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,'\n');
  for (local_5f0._M_dataplus._M_p = (pointer)0x0; local_5f0._M_dataplus._M_p < local_5f8;
      local_5f0._M_dataplus._M_p = local_5f0._M_dataplus._M_p + 1) {
    local_5c8._M_dataplus._M_p = (pointer)&chai;
    std::
    make_shared<std::thread,void(&)(chaiscript::ChaiScript_Basic&,unsigned_long),std::reference_wrapper<chaiscript::ChaiScript_Basic>,unsigned_long&>
              ((_func_void_ChaiScript_Basic_ptr_unsigned_long *)&ss,
               (reference_wrapper<chaiscript::ChaiScript_Basic> *)do_work,
               (unsigned_long *)&local_5c8);
    std::vector<std::shared_ptr<std::thread>,std::allocator<std::shared_ptr<std::thread>>>::
    emplace_back<std::shared_ptr<std::thread>>
              ((vector<std::shared_ptr<std::thread>,std::allocator<std::shared_ptr<std::thread>>> *)
               &threads,(shared_ptr<std::thread> *)&ss);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4d0);
  }
  lVar5 = (long)local_5f8 << 4;
  for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 0x10) {
    std::thread::join();
  }
  pcVar7 = (pointer)0x0;
  local_60c = 0;
  do {
    if (local_5f8 == pcVar7) {
      local_60c = 0;
      break;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::_M_insert<unsigned_long>((ulong)local_4c8);
    std::__cxx11::stringbuf::str();
    std::operator+(&local_5c8,"getvalue(",&local_4f8);
    std::operator+(&local_5f0,&local_5c8,")");
    local_608.
    super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_608.
    super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"__EVAL__",&local_60d);
    iVar2 = chaiscript::ChaiScript_Basic::eval<int>(&chai,&local_5f0,&local_608,&local_518);
    std::__cxx11::string::~string((string *)&local_518);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_608.
                super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::__cxx11::string::~string((string *)&local_4f8);
    if (iVar2 == 0x2faeb9e0) {
      std::__cxx11::stringbuf::str();
      std::operator+(&local_5c8,"getid(",&local_4f8);
      std::operator+(&local_5f0,&local_5c8,")");
      local_608.
      super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_608.
      super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"__EVAL__",&local_60d)
      ;
      iVar2 = chaiscript::ChaiScript_Basic::eval<int>(&chai,&local_5f0,&local_608,&local_518);
      std::__cxx11::string::~string((string *)&local_518);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_608.
                  super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__cxx11::string::~string((string *)&local_5f0);
      std::__cxx11::string::~string((string *)&local_5c8);
      std::__cxx11::string::~string((string *)&local_4f8);
      bVar8 = (int)pcVar7 == iVar2;
      if (!bVar8) {
        local_60c = 1;
      }
    }
    else {
      bVar8 = false;
      local_60c = 1;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    pcVar7 = pcVar7 + 1;
  } while (bVar8);
  std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::~vector
            (&threads);
  chaiscript::ChaiScript_Basic::~ChaiScript_Basic(&chai);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&modulepaths);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&usepaths);
  return local_60c;
}

Assistant:

int main() {
// Disable deprecation warning for getenv call.
#ifdef CHAISCRIPT_MSVC
#ifdef max // Why Microsoft? why?
#undef max
#endif
#pragma warning(push)
#pragma warning(disable : 4996)
#endif

  const char *usepath = getenv("CHAI_USE_PATH");
  const char *modulepath = getenv("CHAI_MODULE_PATH");

#ifdef CHAISCRIPT_MSVC
#pragma warning(pop)
#endif

  std::vector<std::string> usepaths;
  usepaths.emplace_back("");
  if (usepath) {
    usepaths.emplace_back(usepath);
  }

  std::vector<std::string> modulepaths;

#ifdef CHAISCRIPT_NO_DYNLOAD
  chaiscript::ChaiScript chai(/* unused */ modulepaths, usepaths);
#else
  modulepaths.emplace_back("");
  if (modulepath) {
    modulepaths.emplace_back(modulepath);
  }

  // For this test we are going to load the dynamic stdlib
  // to make sure it continues to work
  chaiscript::ChaiScript_Basic chai(
      std::make_unique<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Noop_Tracer, chaiscript::optimizer::Optimizer_Default>>(),
      modulepaths,
      usepaths);
#endif

  std::vector<std::shared_ptr<std::thread>> threads;

  // Ensure at least two, but say only 7 on an 8 core processor
  size_t num_threads = static_cast<size_t>(std::max(static_cast<int>(std::thread::hardware_concurrency()) - 1, 2));

  std::cout << "Num threads: " << num_threads << '\n';

  for (size_t i = 0; i < num_threads; ++i) {
    threads.push_back(std::make_shared<std::thread>(do_work, std::ref(chai), i));
  }

  for (size_t i = 0; i < num_threads; ++i) {
    threads[i]->join();
  }

  for (size_t i = 0; i < num_threads; ++i) {
    std::stringstream ss;
    ss << i;
    if (chai.eval<int>("getvalue(" + ss.str() + ")") != expected_value(4000)) {
      return EXIT_FAILURE;
    }

    if (chai.eval<int>("getid(" + ss.str() + ")") != static_cast<int>(i)) {
      return EXIT_FAILURE;
    }
  }

  return EXIT_SUCCESS;
}